

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

string * __thiscall Regex::getData_abi_cxx11_(Regex *this,int i)

{
  int iVar1;
  string *psVar2;
  
  if (getData[abi:cxx11](int)::null_string_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
    if (iVar1 != 0) {
      getData[abi:cxx11](int)::null_string_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getData[abi:cxx11](int)::null_string_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&getData[abi:cxx11](int)::null_string_abi_cxx11_,"");
      __cxa_atexit(std::__cxx11::string::~string,&getData[abi:cxx11](int)::null_string_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
    }
  }
  psVar2 = &getData[abi:cxx11](int)::null_string_abi_cxx11_;
  if ((this->mState == STATE_PARSED) && (i < (int)(this->mGroups).mSize)) {
    psVar2 = &(this->mGroups).mData[(uint)i].string;
  }
  return psVar2;
}

Assistant:

const JHSTD::string &Regex::getData( int i )
{
	static JHSTD::string null_string( "" );

	if ( mState != Regex::STATE_PARSED )
		return null_string;

	if ( i >= (int)mGroups.size() )
		return null_string;

	return mGroups[ i ].string;
}